

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O3

double __thiscall
despot::DESPOT::CheckDESPOTSTAR(DESPOT *this,VNode *vnode,double regularized_value)

{
  DSPOMDP *pDVar1;
  int iVar2;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *pvVar3;
  pointer ppSVar4;
  undefined4 extraout_var;
  VNode *this_00;
  clock_t cVar5;
  VNode *vnode_00;
  clock_t cVar6;
  clock_t cVar7;
  clock_t cVar8;
  ostream *poVar9;
  ulong uVar10;
  double dVar11;
  vector<despot::State_*,_std::allocator<despot::State_*>_> copy;
  RandomStreams streams;
  double local_88;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_78;
  History *local_58;
  RandomStreams local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "--------------------------------------------------------------------------------",0x50
            );
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  pvVar3 = VNode::particles(vnode);
  local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppSVar4 = (pvVar3->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((pvVar3->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppSVar4) {
    uVar10 = 0;
    do {
      pDVar1 = (this->super_Solver).model_;
      iVar2 = (*pDVar1->_vptr_DSPOMDP[0x16])(pDVar1,ppSVar4[uVar10]);
      local_50.streams_.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar2);
      std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
                ((vector<despot::State*,std::allocator<despot::State*>> *)&local_78,
                 (State **)&local_50);
      uVar10 = uVar10 + 1;
      ppSVar4 = (pvVar3->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(pvVar3->
                                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4 >> 3
                             ));
  }
  this_00 = (VNode *)operator_new(0x98);
  VNode::VNode(this_00,&local_78,0,(QNode *)0x0,0xffffffffffffffff);
  RandomStreams::RandomStreams(&local_50,DAT_00192dbc,DAT_00192dc0);
  local_58 = &(this->super_Solver).history_;
  InitBounds(this_00,this->lower_bound_,this->upper_bound_,&local_50,local_58);
  iVar2 = 0;
  local_88 = 0.0;
  do {
    cVar5 = clock();
    vnode_00 = Trial(this_00,&local_50,this->lower_bound_,this->upper_bound_,
                     (this->super_Solver).model_,local_58,(SearchStatistics *)0x0);
    cVar6 = clock();
    cVar7 = clock();
    Backup(vnode_00);
    cVar8 = clock();
    dVar11 = VNode::lower_bound(this_00);
    local_88 = ((double)cVar8 - (double)cVar7) / 1000000.0 +
               local_88 + ((double)cVar6 - (double)cVar5) / 1000000.0;
    iVar2 = iVar2 + 1;
  } while (dVar11 < regularized_value);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"DESPOT: # trials = ",0x13);
  poVar9 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"; target = ",0xb);
  poVar9 = std::ostream::_M_insert<double>(regularized_value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", current = ",0xc);
  dVar11 = VNode::lower_bound(this_00);
  poVar9 = std::ostream::_M_insert<double>(dVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", l = ",6);
  dVar11 = VNode::lower_bound(this_00);
  poVar9 = std::ostream::_M_insert<double>(dVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,", u = ",6);
  dVar11 = VNode::upper_bound(this_00);
  poVar9 = std::ostream::_M_insert<double>(dVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"; time = ",9);
  poVar9 = std::ostream::_M_insert<double>(local_88);
  std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "--------------------------------------------------------------------------------",0x50
            );
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  VNode::Free(this_00,(this->super_Solver).model_);
  VNode::~VNode(this_00);
  operator_delete(this_00,0x98);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_50.streams_);
  if (local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return local_88;
}

Assistant:

double DESPOT::CheckDESPOTSTAR(const VNode* vnode, double regularized_value) {
	cout
		<< "--------------------------------------------------------------------------------"
		<< endl;

	const vector<State*>& particles = vnode->particles();
	vector<State*> copy;
	for (int i = 0; i < particles.size(); i++) {
		copy.push_back(model_->Copy(particles[i]));
	}
	VNode* root = new VNode(copy);

	RandomStreams streams = RandomStreams(Globals::config.num_scenarios,
		Globals::config.search_depth);
	InitBounds(root, lower_bound_, upper_bound_, streams, history_);

	double used_time = 0;
	int num_trials = 0;
	do {
		double start = clock();
		VNode* cur = Trial(root, streams, lower_bound_, upper_bound_, model_, history_);
		num_trials++;
		used_time += double(clock() - start) / CLOCKS_PER_SEC;

		start = clock();
		Backup(cur);
		used_time += double(clock() - start) / CLOCKS_PER_SEC;
	} while (root->lower_bound() < regularized_value);

	cout << "DESPOT: # trials = " << num_trials << "; target = "
		<< regularized_value << ", current = " << root->lower_bound()
		<< ", l = " << root->lower_bound() << ", u = " << root->upper_bound()
		<< "; time = " << used_time << endl;
	cout
		<< "--------------------------------------------------------------------------------"
		<< endl;

	root->Free(*model_);
	delete root;

	return used_time;
}